

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O1

_Bool cmd_menu(command_list *list,void *selection_p)

{
  cmd_info_conflict *pcVar1;
  int iVar2;
  _Bool _Var3;
  size_t sVar4;
  long lVar5;
  ui_event_type uVar6;
  ui_event uVar7;
  region_conflict area;
  menu_conflict menu;
  menu_iter commands_menu;
  region_conflict local_118;
  menu_conflict local_108;
  menu_iter local_58;
  
  local_58.resize = (_func_void_menu_ptr_conflict *)0x0;
  local_58.display_row = cmd_sub_entry;
  local_58.row_handler = (_func__Bool_menu_ptr_ui_event_ptr_int *)0x0;
  local_58.get_tag = (_func_char_menu_ptr_int *)0x0;
  local_58.valid_row = (_func_int_menu_ptr_int *)0x0;
  local_118.col = 0x17;
  local_118.row = 4;
  local_118.width = 0x25;
  local_118.page_rows = 0xd;
  menu_init(&local_108,MN_SKIN_SCROLL,&local_58);
  menu_setpriv(&local_108,(int)list->len,list->list);
  iVar2 = local_118.col + list->menu_level * 2;
  local_118.row = local_118.row - list->menu_level;
  local_118.col = iVar2;
  if (local_118.row < 2) {
    __assert_fail("area.row > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-context.c"
                  ,0x493,"_Bool cmd_menu(struct command_list *, void *)");
  }
  menu_layout(&local_108,&local_118);
  screen_save();
  window_make(local_118.col + L'\xfffffffe',local_118.row + L'\xffffffff',local_118.col + L'\'',
              local_118.row + L'\r');
  do {
    while( true ) {
      uVar7 = menu_select(&local_108,0,true);
      uVar6 = uVar7.type;
      if (uVar6 == EVT_SELECT) break;
      if (uVar6 == EVT_ESCAPE) {
LAB_001d9907:
        if (((uVar6 == EVT_SELECT) || (screen_save_depth < 2)) ||
           ((tile_width < 2 && (tile_height < 2)))) {
          screen_load();
        }
        else {
          screen_load_all();
        }
        return uVar6 != EVT_SELECT;
      }
    }
    pcVar1 = list->list + local_108.cursor;
    if ((list->list[local_108.cursor].cmd != CMD_NULL) || (pcVar1->hook != (_func_void *)0x0)) {
      *(cmd_info_conflict **)selection_p = pcVar1;
      goto LAB_001d9907;
    }
    if (pcVar1->nested_cached_idx == -1) {
      sVar4 = cmd_list_lookup_by_name(pcVar1->nested_name);
      list->list[local_108.cursor].nested_cached_idx = (int)sVar4;
    }
    lVar5 = (long)list->list[local_108.cursor].nested_cached_idx;
    if ((lVar5 < 0) || (_Var3 = cmd_menu(cmds_all + lVar5,selection_p), !_Var3)) goto LAB_001d9907;
  } while( true );
}

Assistant:

static bool cmd_menu(struct command_list *list, void *selection_p)
{
	struct menu menu;
	menu_iter commands_menu = { NULL, NULL, cmd_sub_entry, NULL, NULL };
	region area = { 23, 4, 37, 13 };

	ui_event evt;
	struct cmd_info **selection = selection_p;
	/*
	 * By default, cause the containing menu to break out of its event
	 * handling when this function returns.
	 */
	bool result = false;

	/* Set up the menu */
	menu_init(&menu, MN_SKIN_SCROLL, &commands_menu);
	menu_setpriv(&menu, list->len, list->list);
	area.col += 2 * list->menu_level;
	area.row -= list->menu_level;
	assert(area.row > 1);
	menu_layout(&menu, &area);

	/* Set up the screen */
	screen_save();
	window_make(area.col - 2, area.row - 1, area.col + 39, area.row + 13);

	while (1) {
		/* Select an entry */
		evt = menu_select(&menu, 0, true);

		if (evt.type == EVT_SELECT) {
			if (list->list[menu.cursor].cmd ||
					list->list[menu.cursor].hook) {
				/* It's a proper command. */
				*selection = &list->list[menu.cursor];
				break;
			} else {
				/*
				 * It's a placeholder that's a parent for a
				 * nested menu.
				 */
				/*
				 * Look up the list of commands for the nested
				 * menu.
				 */
				if (list->list[menu.cursor].nested_cached_idx == -1) {
					list->list[menu.cursor].nested_cached_idx =
						cmd_list_lookup_by_name(list->list[menu.cursor].nested_name);
				}
				if (list->list[menu.cursor].nested_cached_idx >= 0) {
					/* Display a menu for it. */
					if (!cmd_menu(&cmds_all[list->list[menu.cursor].nested_cached_idx], selection_p)) {
						break;
					}
				} else {
					break;
				}
			}
		} else if (evt.type == EVT_ESCAPE) {
			/*
			 * Return to the containing menu and don't break out all
			 * the way to main game loop.
			 */
			result = true;
			break;
		}
	}

	/*
	 * Load the screen.  Do a more expensive update if not breaking out
	 * all the way from the menus and there may be partially overwritten
	 * big tiles.
	 */
	if (result && screen_save_depth > 1
			&& (tile_width > 1 || tile_height > 1)) {
		screen_load_all();
	} else {
		screen_load();
	}

	return result;
}